

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::triangle
          (ImGuiDrawListGraphicsAdaptor *this,float x1,float y1,float x2,float y2,float x3,float y3,
          bool fill,color *c)

{
  byte in_SIL;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  undefined8 in_stack_ffffffffffffff70;
  ImVec2 IVar1;
  float col;
  ImVec2 *in_stack_ffffffffffffff80;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  ImVec2 local_68;
  ImVec2 local_60 [3];
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38 [2];
  byte local_21;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  local_21 = in_SIL & 1;
  local_20 = in_XMM5_Da;
  local_1c = in_XMM4_Da;
  local_18 = in_XMM3_Da;
  local_14 = in_XMM2_Da;
  if (local_21 == 0) {
    ImVec2::ImVec2(local_60,in_XMM0_Da,in_XMM1_Da);
    ImVec2::ImVec2(&local_68,local_14,local_18);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,local_1c,local_20);
    ImColor::ImColor((ImColor *)in_stack_ffffffffffffff80,(float)((ulong)in_RDI >> 0x20),
                     SUB84(in_RDI,0),(float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (float)in_stack_ffffffffffffff70);
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x19753b);
    ImDrawList::AddTriangle
              ((ImDrawList *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_RDI,(ImU32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (float)in_stack_ffffffffffffff70);
  }
  else {
    IVar1 = *in_RDI;
    ImVec2::ImVec2(local_38,in_XMM0_Da,in_XMM1_Da);
    ImVec2::ImVec2(&local_40,local_14,local_18);
    ImVec2::ImVec2(&local_48,local_1c,local_20);
    ImColor::ImColor((ImColor *)in_stack_ffffffffffffff80,(float)((ulong)in_RDI >> 0x20),
                     SUB84(in_RDI,0),IVar1.y,IVar1.x);
    col = IVar1.y;
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x197478);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_RDI,(ImU32)col);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::triangle(float x1, float y1, float x2,
                                            float y2, float x3, float y3,
                                            bool fill, const color::color& c) {
    if (fill) {
        draw_list->AddTriangleFilled(ImVec2(x1, y1), ImVec2(x2, y2),
                                     ImVec2(x3, y3),
                                     ImColor(c.r, c.g, c.b, c.a));
    } else {
        draw_list->AddTriangle(ImVec2(x1, y1), ImVec2(x2, y2), ImVec2(x3, y3),
                               ImColor(c.r, c.g, c.b, c.a));
    }
}